

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_mul_2d(mp_int *a,int b,mp_int *c)

{
  mp_digit *pmVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  if ((a != c) && (iVar4 = mp_copy(a,c), iVar4 != 0)) {
    return iVar4;
  }
  iVar4 = c->used + b / 0x3c;
  if ((c->alloc <= iVar4) && (iVar4 = mp_grow(c,iVar4 + 1), iVar4 != 0)) {
    return iVar4;
  }
  if ((0x3b < b) && (iVar4 = mp_lshd(c,b / 0x3c), iVar4 != 0)) {
    return iVar4;
  }
  if ((int)((long)b % 0x3c) != 0) {
    bVar3 = (byte)((long)b % 0x3c);
    pmVar1 = c->dp;
    iVar4 = c->used;
    lVar5 = 0;
    iVar6 = 0;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    uVar7 = 0;
    for (; iVar6 != (int)lVar5; lVar5 = lVar5 + 1) {
      uVar2 = pmVar1[lVar5];
      pmVar1[lVar5] = (uVar2 << (bVar3 & 0x3f) | uVar7) & 0xfffffffffffffff;
      uVar7 = uVar2 >> (0x3c - bVar3 & 0x3f) & ~(-1L << (bVar3 & 0x3f));
    }
    if (uVar7 != 0) {
      c->used = iVar4 + 1;
      pmVar1[iVar4] = uVar7;
    }
  }
  mp_clamp(c);
  return 0;
}

Assistant:

int mp_mul_2d (mp_int * a, int b, mp_int * c)
{
  mp_digit d;
  int      res;

  /* copy */
  if (a != c) {
     if ((res = mp_copy (a, c)) != MP_OKAY) {
       return res;
     }
  }

  if (c->alloc < (int)(c->used + b/DIGIT_BIT + 1)) {
     if ((res = mp_grow (c, c->used + b / DIGIT_BIT + 1)) != MP_OKAY) {
       return res;
     }
  }

  /* shift by as many digits in the bit count */
  if (b >= (int)DIGIT_BIT) {
    if ((res = mp_lshd (c, b / DIGIT_BIT)) != MP_OKAY) {
      return res;
    }
  }

  /* shift any bit count < DIGIT_BIT */
  d = (mp_digit) (b % DIGIT_BIT);
  if (d != 0) {
    register mp_digit *tmpc, shift, mask, r, rr;
    register int x;

    /* bitmask for carries */
    mask = (((mp_digit)1) << d) - 1;

    /* shift for msbs */
    shift = DIGIT_BIT - d;

    /* alias */
    tmpc = c->dp;

    /* carry */
    r    = 0;
    for (x = 0; x < c->used; x++) {
      /* get the higher bits of the current word */
      rr = (*tmpc >> shift) & mask;

      /* shift the current word and OR in the carry */
      *tmpc = ((*tmpc << d) | r) & MP_MASK;
      ++tmpc;

      /* set the carry to the carry bits of the current word */
      r = rr;
    }
    
    /* set final carry */
    if (r != 0) {
       c->dp[(c->used)++] = r;
    }
  }
  mp_clamp (c);
  return MP_OKAY;
}